

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

string * __thiscall
assembler::asmcode::operand_to_string_abi_cxx11_
          (string *__return_storage_ptr__,asmcode *this,operand op)

{
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  operand op_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EMPTY",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"AL",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"AH",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BL",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BH",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CL",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CH",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DL",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DH",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RAX",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RBX",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RCX",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RDX",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RSI",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RDI",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RSP",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RBP",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case 0x11:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R8",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  case 0x12:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R9",&local_36);
    std::allocator<char>::~allocator(&local_36);
    break;
  case 0x13:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R10",&local_37);
    std::allocator<char>::~allocator(&local_37);
    break;
  case 0x14:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R11",&local_38);
    std::allocator<char>::~allocator(&local_38);
    break;
  case 0x15:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R12",&local_39);
    std::allocator<char>::~allocator(&local_39);
    break;
  case 0x16:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R13",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
    break;
  case 0x17:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R14",&local_3b);
    std::allocator<char>::~allocator(&local_3b);
    break;
  case 0x18:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"R15",&local_3c);
    std::allocator<char>::~allocator(&local_3c);
    break;
  case 0x19:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RAX",&local_3d);
    std::allocator<char>::~allocator(&local_3d);
    break;
  case 0x1a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RBX",&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    break;
  case 0x1b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RCX",&local_3f);
    std::allocator<char>::~allocator(&local_3f);
    break;
  case 0x1c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RDX",&local_40);
    std::allocator<char>::~allocator(&local_40);
    break;
  case 0x1d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RDI",&local_41);
    std::allocator<char>::~allocator(&local_41);
    break;
  case 0x1e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RSI",&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  case 0x1f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RSP",&local_43);
    std::allocator<char>::~allocator(&local_43);
    break;
  case 0x20:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_RBP",&local_44);
    std::allocator<char>::~allocator(&local_44);
    break;
  case 0x21:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R8",&local_45);
    std::allocator<char>::~allocator(&local_45);
    break;
  case 0x22:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R9",&local_46);
    std::allocator<char>::~allocator(&local_46);
    break;
  case 0x23:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R10",&local_47);
    std::allocator<char>::~allocator(&local_47);
    break;
  case 0x24:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R11",&local_48);
    std::allocator<char>::~allocator(&local_48);
    break;
  case 0x25:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R12",&local_49);
    std::allocator<char>::~allocator(&local_49);
    break;
  case 0x26:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R13",&local_4a);
    std::allocator<char>::~allocator(&local_4a);
    break;
  case 0x27:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R14",&local_4b);
    std::allocator<char>::~allocator(&local_4b);
    break;
  case 0x28:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MEM_R15",&local_4c);
    std::allocator<char>::~allocator(&local_4c);
    break;
  case 0x29:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RAX",&local_4d);
    std::allocator<char>::~allocator(&local_4d);
    break;
  case 0x2a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RBX",&local_4e);
    std::allocator<char>::~allocator(&local_4e);
    break;
  case 0x2b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RCX",&local_4f);
    std::allocator<char>::~allocator(&local_4f);
    break;
  case 0x2c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RDX",&local_50);
    std::allocator<char>::~allocator(&local_50);
    break;
  case 0x2d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RDI",&local_51);
    std::allocator<char>::~allocator(&local_51);
    break;
  case 0x2e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RSI",&local_52);
    std::allocator<char>::~allocator(&local_52);
    break;
  case 0x2f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RSP",&local_53);
    std::allocator<char>::~allocator(&local_53);
    break;
  case 0x30:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_RBP",&local_54);
    std::allocator<char>::~allocator(&local_54);
    break;
  case 0x31:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R8",&local_55);
    std::allocator<char>::~allocator(&local_55);
    break;
  case 0x32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R9",&local_56);
    std::allocator<char>::~allocator(&local_56);
    break;
  case 0x33:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R10",&local_57);
    std::allocator<char>::~allocator(&local_57);
    break;
  case 0x34:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R11",&local_58);
    std::allocator<char>::~allocator(&local_58);
    break;
  case 0x35:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R12",&local_59);
    std::allocator<char>::~allocator(&local_59);
    break;
  case 0x36:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R13",&local_5a);
    std::allocator<char>::~allocator(&local_5a);
    break;
  case 0x37:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R14",&local_5b);
    std::allocator<char>::~allocator(&local_5b);
    break;
  case 0x38:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"BYTE_MEM_R15",&local_5c);
    std::allocator<char>::~allocator(&local_5c);
    break;
  case 0x39:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NUMBER",&local_5d);
    std::allocator<char>::~allocator(&local_5d);
    break;
  case 0x3a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST0",&local_5e);
    std::allocator<char>::~allocator(&local_5e);
    break;
  case 0x3b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST1",&local_5f);
    std::allocator<char>::~allocator(&local_5f);
    break;
  case 0x3c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST2",&local_60);
    std::allocator<char>::~allocator(&local_60);
    break;
  case 0x3d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST3",&local_61);
    std::allocator<char>::~allocator(&local_61);
    break;
  case 0x3e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST4",&local_62);
    std::allocator<char>::~allocator(&local_62);
    break;
  case 0x3f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST5",&local_63);
    std::allocator<char>::~allocator(&local_63);
    break;
  case 0x40:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST6",&local_64);
    std::allocator<char>::~allocator(&local_64);
    break;
  case 0x41:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ST7",&local_65);
    std::allocator<char>::~allocator(&local_65);
    break;
  case 0x42:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LABELADDRESS",&local_76);
    std::allocator<char>::~allocator(&local_76);
    break;
  case 0x43:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM0",&local_66);
    std::allocator<char>::~allocator(&local_66);
    break;
  case 0x44:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM1",&local_67);
    std::allocator<char>::~allocator(&local_67);
    break;
  case 0x45:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM2",&local_68);
    std::allocator<char>::~allocator(&local_68);
    break;
  case 0x46:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM3",&local_69);
    std::allocator<char>::~allocator(&local_69);
    break;
  case 0x47:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM4",&local_6a);
    std::allocator<char>::~allocator(&local_6a);
    break;
  case 0x48:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM5",&local_6b);
    std::allocator<char>::~allocator(&local_6b);
    break;
  case 0x49:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM6",&local_6c);
    std::allocator<char>::~allocator(&local_6c);
    break;
  case 0x4a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM7",&local_6d);
    std::allocator<char>::~allocator(&local_6d);
    break;
  case 0x4b:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM8",&local_6e);
    std::allocator<char>::~allocator(&local_6e);
    break;
  case 0x4c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM9",&local_6f);
    std::allocator<char>::~allocator(&local_6f);
    break;
  case 0x4d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM10",&local_70);
    std::allocator<char>::~allocator(&local_70);
    break;
  case 0x4e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM11",&local_71);
    std::allocator<char>::~allocator(&local_71);
    break;
  case 0x4f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM12",&local_72);
    std::allocator<char>::~allocator(&local_72);
    break;
  case 0x50:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM13",&local_73);
    std::allocator<char>::~allocator(&local_73);
    break;
  case 0x51:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM14",&local_74);
    std::allocator<char>::~allocator(&local_74);
    break;
  case 0x52:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XMM15",&local_75);
    std::allocator<char>::~allocator(&local_75);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string asmcode::operand_to_string(operand op)
  {
  switch (op)
    {
    case asmcode::EMPTY: return std::string("EMPTY");
    case asmcode::AL: return std::string("AL");
    case asmcode::AH: return std::string("AH");
    case asmcode::BL: return std::string("BL");
    case asmcode::BH: return std::string("BH");
    case asmcode::CL: return std::string("CL");
    case asmcode::CH: return std::string("CH");
    case asmcode::DL: return std::string("DL");
    case asmcode::DH: return std::string("DH");   
    case asmcode::RAX: return std::string("RAX");
    case asmcode::RBX: return std::string("RBX");
    case asmcode::RCX: return std::string("RCX");
    case asmcode::RDX: return std::string("RDX");
    case asmcode::RDI: return std::string("RDI");
    case asmcode::RSI: return std::string("RSI");
    case asmcode::RSP: return std::string("RSP");
    case asmcode::RBP: return std::string("RBP");
    case asmcode::R8:  return std::string("R8");
    case asmcode::R9:  return std::string("R9");
    case asmcode::R10: return std::string("R10");
    case asmcode::R11: return std::string("R11");
    case asmcode::R12: return std::string("R12");
    case asmcode::R13: return std::string("R13");
    case asmcode::R14: return std::string("R14");
    case asmcode::R15: return std::string("R15");  
    case asmcode::MEM_RAX: return std::string("MEM_RAX");
    case asmcode::MEM_RBX: return std::string("MEM_RBX");
    case asmcode::MEM_RCX: return std::string("MEM_RCX");
    case asmcode::MEM_RDX: return std::string("MEM_RDX");
    case asmcode::MEM_RDI: return std::string("MEM_RDI");
    case asmcode::MEM_RSI: return std::string("MEM_RSI");
    case asmcode::MEM_RSP: return std::string("MEM_RSP");
    case asmcode::MEM_RBP: return std::string("MEM_RBP");
    case asmcode::MEM_R8:  return std::string("MEM_R8");
    case asmcode::MEM_R9:  return std::string("MEM_R9");
    case asmcode::MEM_R10: return std::string("MEM_R10");
    case asmcode::MEM_R11: return std::string("MEM_R11");
    case asmcode::MEM_R12: return std::string("MEM_R12");
    case asmcode::MEM_R13: return std::string("MEM_R13");
    case asmcode::MEM_R14: return std::string("MEM_R14");
    case asmcode::MEM_R15: return std::string("MEM_R15");
    case asmcode::BYTE_MEM_RAX: return std::string("BYTE_MEM_RAX");
    case asmcode::BYTE_MEM_RBX: return std::string("BYTE_MEM_RBX");
    case asmcode::BYTE_MEM_RCX: return std::string("BYTE_MEM_RCX");
    case asmcode::BYTE_MEM_RDX: return std::string("BYTE_MEM_RDX");
    case asmcode::BYTE_MEM_RDI: return std::string("BYTE_MEM_RDI");
    case asmcode::BYTE_MEM_RSI: return std::string("BYTE_MEM_RSI");
    case asmcode::BYTE_MEM_RSP: return std::string("BYTE_MEM_RSP");
    case asmcode::BYTE_MEM_RBP: return std::string("BYTE_MEM_RBP");
    case asmcode::BYTE_MEM_R8:  return std::string("BYTE_MEM_R8");
    case asmcode::BYTE_MEM_R9:  return std::string("BYTE_MEM_R9");
    case asmcode::BYTE_MEM_R10: return std::string("BYTE_MEM_R10");
    case asmcode::BYTE_MEM_R11: return std::string("BYTE_MEM_R11");
    case asmcode::BYTE_MEM_R12: return std::string("BYTE_MEM_R12");
    case asmcode::BYTE_MEM_R13: return std::string("BYTE_MEM_R13");
    case asmcode::BYTE_MEM_R14: return std::string("BYTE_MEM_R14");
    case asmcode::BYTE_MEM_R15: return std::string("BYTE_MEM_R15");  
    case asmcode::NUMBER: return std::string("NUMBER");
    case asmcode::ST0:  return std::string("ST0");
    case asmcode::ST1:  return std::string("ST1");
    case asmcode::ST2:  return std::string("ST2");
    case asmcode::ST3:  return std::string("ST3");
    case asmcode::ST4:  return std::string("ST4");
    case asmcode::ST5:  return std::string("ST5");
    case asmcode::ST6:  return std::string("ST6");
    case asmcode::ST7:  return std::string("ST7");
    case asmcode::XMM0: return std::string("XMM0");
    case asmcode::XMM1: return std::string("XMM1");
    case asmcode::XMM2: return std::string("XMM2");
    case asmcode::XMM3: return std::string("XMM3");
    case asmcode::XMM4: return std::string("XMM4");
    case asmcode::XMM5: return std::string("XMM5");
    case asmcode::XMM6: return std::string("XMM6");
    case asmcode::XMM7: return std::string("XMM7");
    case asmcode::XMM8: return std::string("XMM8");
    case asmcode::XMM9: return std::string("XMM9");
    case asmcode::XMM10:return std::string("XMM10");
    case asmcode::XMM11:return std::string("XMM11");
    case asmcode::XMM12:return std::string("XMM12");
    case asmcode::XMM13:return std::string("XMM13");
    case asmcode::XMM14:return std::string("XMM14");
    case asmcode::XMM15:return std::string("XMM15");   
    case asmcode::LABELADDRESS: return std::string("LABELADDRESS");
    }
  return std::string();
  }